

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvtree.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  tchar_t local_568 [8];
  tchar_t Path [1024];
  stream *Input;
  parsercontext p;
  char **argv_local;
  int argc_local;
  
  p.StrTab.Table._Used = (size_t)argv;
  if ((argc == 2) || (argc == 3)) {
    if (argc == 3) {
      iVar1 = strcmp(argv[1],"--pos");
      if (iVar1 != 0) goto LAB_00105654;
    }
    if (argc == 3) {
      ShowPos = 1;
    }
    ParserContext_Init((parsercontext *)&Input,(nodemeta *)0x0,(cc_memheap *)0x0,(cc_memheap *)0x0);
    MATROSKA_Init((parsercontext *)&Input);
    Node_FromStr(&Input,local_568,0x400,*(char **)(p.StrTab.Table._Used + (long)(argc + -1) * 8));
    Path._1016_8_ = StreamOpen(&Input,local_568,1);
    if ((stream *)Path._1016_8_ == (stream *)0x0) {
      fprintf(_stderr,"error: mkvtree cannot open file \"%s\"\r\n",
              *(undefined8 *)(p.StrTab.Table._Used + 8));
    }
    else {
      OutputTree((stream *)Path._1016_8_);
      StreamClose((stream *)Path._1016_8_);
    }
    ParserContext_Done((parsercontext *)&Input);
    argv_local._4_4_ = 0;
  }
  else {
LAB_00105654:
    fprintf(_stderr,"Usage: mkvtree --pos [matroska_file]\r\n");
    fprintf(_stderr,"Options:\r\n");
    fprintf(_stderr,"  --pos     output the position of elements\r\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[])
{
    parsercontext p;
    struct stream *Input;
    tchar_t Path[MAXPATHFULL];

    if ((argc!=2 && argc!=3) || (argc==3 && strcmp(argv[1],"--pos")))
    {
        fprintf(stderr, "Usage: mkvtree --pos [matroska_file]\r\n");
		fprintf(stderr, "Options:\r\n");
		fprintf(stderr, "  --pos     output the position of elements\r\n");
        return 1;
    }

    if (argc==3)
        ShowPos = 1;

    // Core-C init phase
    ParserContext_Init(&p,NULL,NULL,NULL);
    // EBML & Matroska Init
    MATROSKA_Init(&p);

    // open the file to parse
    Node_FromStr(&p,Path,TSIZEOF(Path),argv[argc-1]);
    Input = StreamOpen(&p,Path,SFLAG_RDONLY/*|SFLAG_BUFFERED*/);
    if (Input == NULL)
        fprintf(stderr, "error: mkvtree cannot open file \"%s\"\r\n",argv[1]);
    else
    {
        OutputTree(Input);

        StreamClose(Input);
    }

    // Core-C ending
    ParserContext_Done(&p);

    return 0;
}